

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int rf_bytes_per_pixel(rf_uncompressed_pixel_format format)

{
  int local_c;
  rf_uncompressed_pixel_format format_local;
  
  switch(format) {
  case RF_UNCOMPRESSED_GRAYSCALE:
    local_c = 1;
    break;
  case RF_UNCOMPRESSED_GRAY_ALPHA:
    local_c = 2;
    break;
  case RF_UNCOMPRESSED_R5G6B5:
    local_c = 2;
    break;
  case RF_UNCOMPRESSED_R8G8B8:
    local_c = 3;
    break;
  case RF_UNCOMPRESSED_R5G5B5A1:
    local_c = 2;
    break;
  case RF_UNCOMPRESSED_R4G4B4A4:
    local_c = 2;
    break;
  case RF_UNCOMPRESSED_R8G8B8A8:
    local_c = 4;
    break;
  case RF_UNCOMPRESSED_R32:
    local_c = 4;
    break;
  case RF_UNCOMPRESSED_R32G32B32:
    local_c = 0xc;
    break;
  case RF_UNCOMPRESSED_NORMALIZED:
    local_c = 0x10;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

RF_API int rf_bytes_per_pixel(rf_uncompressed_pixel_format format)
{
    switch (format)
    {
        case RF_UNCOMPRESSED_GRAYSCALE: return 1;
        case RF_UNCOMPRESSED_GRAY_ALPHA: return 2;
        case RF_UNCOMPRESSED_R5G5B5A1: return 2;
        case RF_UNCOMPRESSED_R5G6B5: return 2;
        case RF_UNCOMPRESSED_R4G4B4A4: return 2;
        case RF_UNCOMPRESSED_R8G8B8A8: return 4;
        case RF_UNCOMPRESSED_R8G8B8: return 3;
        case RF_UNCOMPRESSED_R32: return 4;
        case RF_UNCOMPRESSED_R32G32B32: return 12;
        case RF_UNCOMPRESSED_R32G32B32A32: return 16;
        default: return 0;
    }
}